

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

drmModePropertyBlobPtr __thiscall
QKmsDevice::connectorPropertyBlob(QKmsDevice *this,drmModeConnectorPtr connector,QByteArray *name)

{
  int iVar1;
  long lVar2;
  char *__s2;
  long in_RSI;
  long in_RDI;
  int i;
  drmModePropertyBlobPtr blob;
  drmModePropertyPtr prop;
  int local_2c;
  drmModePropertyBlobPtr local_28;
  
  local_28 = (drmModePropertyBlobPtr)0x0;
  for (local_2c = 0; local_2c < *(int *)(in_RSI + 0x30) && local_28 == (drmModePropertyBlobPtr)0x0;
      local_2c = local_2c + 1) {
    lVar2 = drmModeGetProperty(*(undefined4 *)(in_RDI + 0x28),
                               *(undefined4 *)(*(long *)(in_RSI + 0x38) + (long)local_2c * 4));
    if (lVar2 != 0) {
      if ((*(uint *)(lVar2 + 4) & 0x10) != 0) {
        __s2 = QByteArray::constData((QByteArray *)0x164415);
        iVar1 = strcmp((char *)(lVar2 + 8),__s2);
        if (iVar1 == 0) {
          local_28 = (drmModePropertyBlobPtr)
                     drmModeGetPropertyBlob
                               (*(undefined4 *)(in_RDI + 0x28),
                                *(ulong *)(*(long *)(in_RSI + 0x40) + (long)local_2c * 8) &
                                0xffffffff);
        }
      }
      drmModeFreeProperty(lVar2);
    }
  }
  return local_28;
}

Assistant:

drmModePropertyBlobPtr QKmsDevice::connectorPropertyBlob(drmModeConnectorPtr connector, const QByteArray &name)
{
    drmModePropertyPtr prop;
    drmModePropertyBlobPtr blob = nullptr;

    for (int i = 0; i < connector->count_props && !blob; i++) {
        prop = drmModeGetProperty(m_dri_fd, connector->props[i]);
        if (!prop)
            continue;
        if ((prop->flags & DRM_MODE_PROP_BLOB) && (strcmp(prop->name, name.constData()) == 0))
            blob = drmModeGetPropertyBlob(m_dri_fd, connector->prop_values[i]);
        drmModeFreeProperty(prop);
    }

    return blob;
}